

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::IsRFC7343(CNetAddr *this)

{
  bool bVar1;
  byte *pbVar2;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  CNetAddr *in_stack_ffffffffffffffc8;
  size_type in_stack_ffffffffffffffd4;
  bool local_19;
  undefined5 in_stack_fffffffffffffff0;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *obj;
  
  obj = *(prevector<16U,_unsigned_char,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28);
  bVar1 = IsIPv6(in_stack_ffffffffffffffc8);
  local_19 = false;
  if (bVar1) {
    bVar1 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,3ul>
                      (obj,(array<unsigned_char,_3UL> *)
                           (ulong)CONCAT16(1,CONCAT15(0x20,in_stack_fffffffffffffff0)));
    local_19 = false;
    if (bVar1) {
      pbVar2 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                         (in_RDI,in_stack_ffffffffffffffd4);
      local_19 = (*pbVar2 & 0xf0) == 0x20;
    }
  }
  if (*(prevector<16U,_unsigned_char,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28) != obj) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool CNetAddr::IsRFC7343() const
{
    return IsIPv6() && HasPrefix(m_addr, std::array<uint8_t, 3>{0x20, 0x01, 0x00}) &&
           (m_addr[3] & 0xF0) == 0x20;
}